

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-file_reading.c
# Opt level: O0

greatest_test_res fr_agency(void)

{
  int iVar1;
  undefined1 local_2a8 [8];
  agency_t expected [1];
  agency_t *paStack_20;
  int record_count;
  agency_t *records;
  FILE *fp;
  
  records = (agency_t *)fopen("../tests/data/google_sample/agency.txt","r");
  if (records == (agency_t *)0x0) {
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
    ;
    greatest_info.fail_line = 0xb;
    greatest_info.msg = "Couldn\'t open `data/google_sample/agency.txt` test file";
    if ((greatest_info.flags & 4) != 0) {
      abort();
    }
    fp._4_4_ = GREATEST_TEST_RES_FAIL;
  }
  else {
    expected[0].email._60_4_ = read_all_agencies((FILE *)records,&stack0xffffffffffffffe0);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (expected[0].email._60_4_ == 1) {
      memcpy(local_2a8,&DAT_00243580,0x280);
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = equal_agency((agency_t *)local_2a8,paStack_20);
      if (iVar1 == 0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
        ;
        greatest_info.fail_line = 0x1b;
        greatest_info.msg = "equal_agency(&(expected[0]), &(records[0]))";
        if ((greatest_info.flags & 4) != 0) {
          abort();
        }
        fp._4_4_ = GREATEST_TEST_RES_FAIL;
      }
      else {
        if (0 < (int)expected[0].email._60_4_) {
          free(paStack_20);
        }
        if (records != (agency_t *)0x0) {
          fclose((FILE *)records);
        }
        greatest_info.msg = (char *)0x0;
        fp._4_4_ = GREATEST_TEST_RES_PASS;
      }
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
      ;
      greatest_info.fail_line = 0x10;
      greatest_info.msg = "1 != record_count";
      if ((greatest_info.flags & 4) != 0) {
        abort();
      }
      fp._4_4_ = GREATEST_TEST_RES_FAIL;
    }
  }
  return fp._4_4_;
}

Assistant:

TEST fr_agency(void) {
    FILE *fp = fopen("../tests/data/google_sample/agency.txt", "r");
    if (fp == NULL) {
        FAILm("Couldn't open `data/google_sample/agency.txt` test file");
    } else {
        agency_t *records;
        int record_count = read_all_agencies(fp, &records);

        ASSERT_EQ(1, record_count);

        agency_t expected[1] = {
            {
                .id = "DTA",
                .name = "Demo Transit Authority",
                .url = "http://google.com",
                .timezone = "America/Los_Angeles"
            }
        };

        ASSERT(equal_agency(&(expected[0]), &(records[0])));

        if (record_count > 0) free(records);
        if (fp) fclose(fp);
    }
    PASS();
}